

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O3

void __thiscall
TPZMatrix<Fad<double>_>::SolveJacobi
          (TPZMatrix<Fad<double>_> *this,int64_t *numiterations,TPZFMatrix<Fad<double>_> *F,
          TPZFMatrix<Fad<double>_> *result,TPZFMatrix<Fad<double>_> *residual,
          TPZFMatrix<Fad<double>_> *scratch,REAL *tol,int FromCurrent)

{
  long lVar1;
  long lVar2;
  int iVar3;
  undefined4 extraout_var;
  double dVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long local_f0;
  double local_e8;
  undefined1 local_98 [32];
  FadExpr<FadFuncSqrt<Fad<double>_>_> local_78;
  Fad<double> local_50;
  
  if (FromCurrent == 0) {
    TPZFMatrix<Fad<double>_>::operator=(scratch,F);
    (*(result->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
      [0xf])(result);
  }
  else {
    (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x28])(this,result,F);
  }
  Dot<Fad<double>>(&local_50,scratch,scratch);
  FadFuncSqrt<Fad<double>_>::FadFuncSqrt((FadFuncSqrt<Fad<double>_> *)local_98,&local_50);
  FadExpr<FadFuncSqrt<Fad<double>_>_>::FadExpr(&local_78,(FadFuncSqrt<Fad<double>_> *)local_98);
  Fad<double>::~Fad((Fad<double> *)local_98);
  if (local_78.fadexpr_.expr_.val_ < 0.0) {
    local_e8 = sqrt(local_78.fadexpr_.expr_.val_);
  }
  else {
    local_e8 = SQRT(local_78.fadexpr_.expr_.val_);
  }
  Fad<double>::~Fad(&local_78.fadexpr_.expr_);
  Fad<double>::~Fad(&local_50);
  iVar3 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(this);
  if (0 < *numiterations) {
    lVar1 = (F->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol;
    lVar5 = 0;
    do {
      if (ABS(local_e8) < *tol || ABS(local_e8) == *tol) break;
      if (0 < lVar1) {
        local_e8 = 0.0;
        local_f0 = 0;
        do {
          if (0 < CONCAT44(extraout_var,iVar3)) {
            lVar6 = 0;
            lVar7 = 0;
            do {
              lVar2 = (scratch->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
              if ((lVar2 <= lVar7) ||
                 ((scratch->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol <= local_f0)) {
                TPZFMatrix<Fad<double>_>::Error
                          ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              dVar4 = (double)((long)&scratch->fElem->val_ + lVar6 + lVar2 * (long)local_e8);
              (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                        (&local_78,this,lVar7,lVar7);
              lVar2 = (result->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
              local_98._0_8_ = dVar4;
              local_98._8_8_ = &local_78;
              if ((lVar2 <= lVar7) ||
                 ((result->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol <= local_f0)) {
                TPZFMatrix<Fad<double>_>::Error
                          ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              Fad<double>::operator+=
                        ((Fad<double> *)
                         ((long)&result->fElem->val_ + lVar6 + lVar2 * (long)local_e8),
                         (FadExpr<FadBinaryDiv<Fad<double>,_Fad<double>_>_> *)local_98);
              Fad<double>::~Fad((Fad<double> *)&local_78);
              lVar7 = lVar7 + 1;
              lVar6 = lVar6 + 0x20;
            } while (CONCAT44(extraout_var,iVar3) != lVar7);
          }
          local_f0 = local_f0 + 1;
          local_e8 = (double)((long)local_e8 + 0x20);
        } while (local_f0 != lVar1);
      }
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x28])(this,result,F,scratch);
      Dot<Fad<double>>(&local_50,scratch,scratch);
      FadFuncSqrt<Fad<double>_>::FadFuncSqrt((FadFuncSqrt<Fad<double>_> *)local_98,&local_50);
      FadExpr<FadFuncSqrt<Fad<double>_>_>::FadExpr(&local_78,(FadFuncSqrt<Fad<double>_> *)local_98);
      Fad<double>::~Fad((Fad<double> *)local_98);
      if (local_78.fadexpr_.expr_.val_ < 0.0) {
        local_e8 = sqrt(local_78.fadexpr_.expr_.val_);
      }
      else {
        local_e8 = SQRT(local_78.fadexpr_.expr_.val_);
      }
      Fad<double>::~Fad(&local_78.fadexpr_.expr_);
      Fad<double>::~Fad(&local_50);
      lVar5 = lVar5 + 1;
    } while (lVar5 < *numiterations);
  }
  if (residual != (TPZFMatrix<Fad<double>_> *)0x0) {
    TPZFMatrix<Fad<double>_>::operator=(residual,scratch);
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::SolveJacobi(int64_t &numiterations,const TPZFMatrix<TVar> &F, TPZFMatrix<TVar> &result,
								  TPZFMatrix<TVar> *residual, TPZFMatrix<TVar> &scratch, REAL &tol,const int FromCurrent) {
	
	
	if(FromCurrent) {
		Residual(result,F,scratch);
	} else {
		scratch = F;
		result.Zero();
	}
	REAL res;
	res = TPZExtractVal::val(Norm(scratch));
	int64_t r = Dim();
	int64_t c = F.Cols();
	for(int64_t it=0; it<numiterations && (fabs(res)) > tol; it++) {
		for(int64_t ic=0; ic<c; ic++) {
			for(int64_t i=0; i<r; i++) {
				result(i,ic) += (scratch)(i,ic)/GetVal(i,i);
			}
		}
		Residual(result,F,scratch);
		res = TPZExtractVal::val(Norm(scratch));
	}
	if(residual) *residual = scratch;
}